

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void luaK_posfix(FuncState *fs,BinOpr op,expdesc *e1,expdesc *e2,int line)

{
  Instruction *pIVar1;
  anon_union_8_4_e6d17769_for_u aVar2;
  undefined4 uVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  int *l1;
  OpCode op_00;
  Instruction i;
  
  switch(op) {
  case OPR_ADD:
  case OPR_SUB:
  case OPR_MUL:
  case OPR_MOD:
  case OPR_POW:
  case OPR_DIV:
  case OPR_IDIV:
  case OPR_BAND:
  case OPR_BOR:
  case OPR_BXOR:
  case OPR_SHL:
  case OPR_SHR:
    iVar4 = constfolding(fs,op,e1,e2);
    if (iVar4 != 0) {
      return;
    }
    op_00 = op + OPR_EQ;
    goto LAB_0012faa8;
  case OPR_CONCAT:
    luaK_exp2val(fs,e2);
    if (e2->k == VRELOCABLE) {
      pIVar1 = fs->f->code;
      lVar5 = (long)(e2->u).info;
      uVar6 = pIVar1[lVar5];
      if ((uVar6 & 0x3f) == 0x1d) {
        if (((e1->k == VNONRELOC) && (((uint)(e1->u).info >> 8 & 1) == 0)) &&
           ((int)(uint)fs->nactvar <= (e1->u).info)) {
          fs->freereg = fs->freereg + 0xff;
          lVar5 = (long)(e2->u).info;
          uVar6 = pIVar1[lVar5];
        }
        pIVar1[lVar5] = (e1->u).info << 0x17 | uVar6 & 0x7fffff;
        e1->k = VRELOCABLE;
        (e1->u).info = (e2->u).info;
        return;
      }
    }
    luaK_exp2nextreg(fs,e2);
    op_00 = OP_CONCAT;
LAB_0012faa8:
    codebinexpval(fs,op_00,e1,e2,line);
    return;
  case OPR_EQ:
  case OPR_LT:
  case OPR_LE:
  case OPR_NE:
  case OPR_GT:
  case OPR_GE:
    uVar6 = (e1->u).info | 0x100;
    if (e1->k != VK) {
      uVar6 = (e1->u).info;
    }
    iVar4 = luaK_exp2RK(fs,e2);
    freeexps(fs,e1,e2);
    if (op - OPR_GT < 2) {
      i = uVar6 << 0xe | iVar4 << 0x17 | op + OPR_LE | 0x40;
    }
    else if (op == OPR_NE) {
      i = iVar4 << 0xe | uVar6 << 0x17 | 0x1f;
    }
    else {
      i = iVar4 << 0xe | op + OPR_GE | uVar6 << 0x17 | 0x40;
    }
    luaK_code(fs,i);
    iVar4 = luaK_jump(fs);
    (e1->u).info = iVar4;
    e1->k = VJMP;
    return;
  case OPR_AND:
    luaK_dischargevars(fs,e2);
    l1 = &e2->f;
    iVar4 = e1->f;
    break;
  case OPR_OR:
    luaK_dischargevars(fs,e2);
    l1 = &e2->t;
    iVar4 = e1->t;
    break;
  default:
    goto switchD_0012fa83_default;
  }
  luaK_concat(fs,l1,iVar4);
  iVar4 = e2->f;
  e1->t = e2->t;
  e1->f = iVar4;
  uVar3 = *(undefined4 *)&e2->field_0x4;
  aVar2 = e2->u;
  e1->k = e2->k;
  *(undefined4 *)&e1->field_0x4 = uVar3;
  e1->u = aVar2;
switchD_0012fa83_default:
  return;
}

Assistant:

void luaK_posfix (FuncState *fs, BinOpr opr,
                  expdesc *e1, expdesc *e2, int line) {
  luaK_dischargevars(fs, e2);
  if (foldbinop(opr) && constfolding(fs, opr + LUA_OPADD, e1, e2))
    return;  /* done by folding */
  switch (opr) {
    case OPR_AND: {
      lua_assert(e1->t == NO_JUMP);  /* list closed by 'luaK_infix' */
      luaK_concat(fs, &e2->f, e1->f);
      *e1 = *e2;
      break;
    }
    case OPR_OR: {
      lua_assert(e1->f == NO_JUMP);  /* list closed by 'luaK_infix' */
      luaK_concat(fs, &e2->t, e1->t);
      *e1 = *e2;
      break;
    }
    case OPR_CONCAT: {  /* e1 .. e2 */
      luaK_exp2nextreg(fs, e2);
      codeconcat(fs, e1, e2, line);
      break;
    }
    case OPR_ADD: case OPR_MUL: {
      codecommutative(fs, opr, e1, e2, line);
      break;
    }
    case OPR_SUB: {
      if (finishbinexpneg(fs, e1, e2, OP_ADDI, line, TM_SUB))
        break; /* coded as (r1 + -I) */
      /* ELSE */
    }  /* FALLTHROUGH */
    case OPR_DIV: case OPR_IDIV: case OPR_MOD: case OPR_POW: {
      codearith(fs, opr, e1, e2, 0, line);
      break;
    }
    case OPR_BAND: case OPR_BOR: case OPR_BXOR: {
      codebitwise(fs, opr, e1, e2, line);
      break;
    }
    case OPR_SHL: {
      if (isSCint(e1)) {
        swapexps(e1, e2);
        codebini(fs, OP_SHLI, e1, e2, 1, line, TM_SHL);  /* I << r2 */
      }
      else if (finishbinexpneg(fs, e1, e2, OP_SHRI, line, TM_SHL)) {
        /* coded as (r1 >> -I) */;
      }
      else  /* regular case (two registers) */
       codebinexpval(fs, OP_SHL, e1, e2, line);
      break;
    }
    case OPR_SHR: {
      if (isSCint(e2))
        codebini(fs, OP_SHRI, e1, e2, 0, line, TM_SHR);  /* r1 >> I */
      else  /* regular case (two registers) */
        codebinexpval(fs, OP_SHR, e1, e2, line);
      break;
    }
    case OPR_EQ: case OPR_NE: {
      codeeq(fs, opr, e1, e2);
      break;
    }
    case OPR_LT: case OPR_LE: {
      OpCode op = cast(OpCode, (opr - OPR_EQ) + OP_EQ);
      codeorder(fs, op, e1, e2);
      break;
    }
    case OPR_GT: case OPR_GE: {
      /* '(a > b)' <=> '(b < a)';  '(a >= b)' <=> '(b <= a)' */
      OpCode op = cast(OpCode, (opr - OPR_NE) + OP_EQ);
      swapexps(e1, e2);
      codeorder(fs, op, e1, e2);
      break;
    }
    default: lua_assert(0);
  }
}